

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

string * sc_core::localtime_string_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  time_t long_time;
  char buf [200];
  allocator local_e1;
  time_t local_e0;
  char local_d8 [200];
  
  time(&local_e0);
  __tp = localtime(&local_e0);
  strftime(local_d8,199,"%b %d, %Y       %H:%M:%S",__tp);
  std::__cxx11::string::string((string *)in_RDI,local_d8,&local_e1);
  return in_RDI;
}

Assistant:

SC_API std::string
localtime_string()
{
    char buf[200];
    time_t long_time;
    time(&long_time);
    struct tm* p_tm = localtime(&long_time);
    strftime(buf, 199, "%b %d, %Y       %H:%M:%S", p_tm);
    return buf;
}